

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseStart
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  undefined8 uVar1;
  char *pcVar2;
  char *in_stack_00000008;
  char *in_stack_00000010;
  int in_stack_0000001c;
  string counts;
  TestCase *in_stack_ffffffffffffff98;
  string local_30 [48];
  
  TestCase::test_to_run_count((TestCase *)0x181ce8);
  FormatCountableNoun_abi_cxx11_(in_stack_0000001c,in_stack_00000010,in_stack_00000008);
  ColoredPrintf(COLOR_GREEN,"[----------] ");
  uVar1 = std::__cxx11::string::c_str();
  pcVar2 = TestCase::name((TestCase *)0x181d30);
  printf("%s from %s",uVar1,pcVar2);
  pcVar2 = TestCase::type_param(in_stack_ffffffffffffff98);
  if (pcVar2 == (char *)0x0) {
    printf("\n");
  }
  else {
    pcVar2 = TestCase::type_param(in_stack_ffffffffffffff98);
    printf(", where %s = %s\n","TypeParam",pcVar2);
  }
  fflush(_stdout);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseStart(const TestCase& test_case) {
  const std::string counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s", counts.c_str(), test_case.name());
  if (test_case.type_param() == NULL) {
    printf("\n");
  } else {
    printf(", where %s = %s\n", kTypeParamLabel, test_case.type_param());
  }
  fflush(stdout);
}